

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O2

void __thiscall winmd::reader::cache::remove_type(cache *this,string_view *ns,string_view *name)

{
  iterator iVar1;
  anon_class_1_0_00000001 remove;
  undefined1 local_19;
  
  iVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
          ::find(&(this->m_namespaces)._M_t,ns);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_namespaces)._M_t._M_impl.super__Rb_tree_header)
  {
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_19,
               (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
               (iVar1._M_node + 3),name);
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_19,
               (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
               &iVar1._M_node[3]._M_right,name);
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_19,
               (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
               &iVar1._M_node[4]._M_left,name);
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_19,
               (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
               &iVar1._M_node[5]._M_parent,name);
    remove_type(std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&)
    ::{lambda(auto:1&&,auto:2&&)#1}::operator()
              (&local_19,
               (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
               (iVar1._M_node + 6),name);
  }
  return;
}

Assistant:

void remove_type(std::string_view const& ns, std::string_view const& name)
        {
            auto m = m_namespaces.find(ns);
            if (m == m_namespaces.end())
            {
                return;
            }
            auto& members = m->second;

            auto remove = [&](auto&& collection, auto&& name)
            {
                auto pos = std::find_if(collection.begin(), collection.end(), [&](auto&& type)
                    {
                        return type.TypeName() == name;
                    });

                if (pos != collection.end())
                {
                    collection.erase(pos);
                }
            };

            remove(members.interfaces, name);
            remove(members.classes, name);
            remove(members.enums, name);
            remove(members.structs, name);
            remove(members.delegates, name);
        }